

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::StrEqualityMatcher<std::__cxx11::string>::MatchAndExplain<char_const>
          (StrEqualityMatcher<std::__cxx11::string> *this,char *s,MatchResultListener *listener)

{
  byte bVar1;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (s == (char *)0x0) {
    bVar1 = (byte)this[0x20] ^ 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,s,&local_39);
    bVar1 = MatchAndExplain<std::__cxx11::string>(this,&local_38,listener);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (bool)bVar1;
}

Assistant:

bool MatchAndExplain(CharType* s, MatchResultListener* listener) const {
    if (s == NULL) {
      return !expect_eq_;
    }
    return MatchAndExplain(StringType(s), listener);
  }